

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
booster::locale::basic_message<char>::basic_message
          (basic_message<char> *this,string_type *context,string_type *single,string_type *plural,
          int number)

{
  this->n_ = number;
  this->c_id_ = (char_type *)0x0;
  this->c_context_ = (char_type *)0x0;
  this->c_plural_ = (char_type *)0x0;
  std::__cxx11::string::string((string *)&this->id_,(string *)single);
  std::__cxx11::string::string((string *)&this->context_,(string *)context);
  std::__cxx11::string::string((string *)&this->plural_,(string *)plural);
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &single,string_type const &plural,int number) :
                n_(number),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(single),
                context_(context),
                plural_(plural)
            {
            }